

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grounder.cpp
# Opt level: O1

bool __thiscall
Kernel::GlobalSubsumptionGrounder::OrderNormalizingComparator::operator()
          (OrderNormalizingComparator *this,uint a,uint b)

{
  Term *this_00;
  Term *this_01;
  uint uVar1;
  uint uVar2;
  TermList TVar3;
  bool bVar4;
  
  this_00 = &this->_lits[a]->super_Term;
  this_01 = &this->_lits[b]->super_Term;
  if (this_00 == this_01) {
    TVar3._content = 0;
  }
  else {
    uVar1 = Term::numVarOccs(this_00);
    uVar2 = Term::numVarOccs(this_01);
    if (uVar1 == uVar2) {
      bVar4 = this_00->_weight < this_01->_weight;
      if ((this_00->_weight == this_01->_weight) &&
         (uVar1 = ((uint)this_00->_args[0]._content >> 2 & 1) + this_00->_functor * 2,
         uVar2 = ((uint)this_01->_args[0]._content >> 2 & 1) + this_01->_functor * 2,
         bVar4 = uVar1 < uVar2, uVar1 == uVar2)) {
        if (operator()(unsigned_int,unsigned_int)::dsit == '\0') {
          operator()();
        }
        DisagreementSetIterator::reset(&operator()::dsit,this_00,this_01,false);
        DisagreementSetIterator::hasNext(&operator()::dsit);
        TVar3 = operator()::dsit._arg1;
        operator()::dsit._arg1._content = 2;
        if ((((uint)TVar3._content ^ (uint)operator()::dsit._arg2._content) & 1) != 0)
        goto LAB_00538806;
        if ((TVar3._content & 1) == 0) {
          bVar4 = *(uint *)(TVar3._content + 8) < *(uint *)(operator()::dsit._arg2._content + 8);
        }
        else {
          bVar4 = (uint)(TVar3._content >> 2) < (uint)(operator()::dsit._arg2._content >> 2);
        }
      }
    }
    else {
      uVar1 = Term::numVarOccs(this_00);
      uVar2 = Term::numVarOccs(this_01);
      bVar4 = uVar1 < uVar2;
    }
    TVar3._content = (uint64_t)bVar4;
  }
LAB_00538806:
  return (bool)((byte)TVar3._content & 1);
}

Assistant:

bool operator()(unsigned a, unsigned b) {
    Literal* la = _lits[a];
    Literal* lb = _lits[b];
    if(la==lb) { return false; }
    if(la->numVarOccs()!=lb->numVarOccs()) {
      //first, we want literals with less variables to appear in the
      //beginning as there is better chance to get some sharing across clauses
      return la->numVarOccs()<lb->numVarOccs();
    }
    if(la->weight()!=lb->weight()) {
      return la->weight()<lb->weight();
    }
    if(la->header()!=lb->header()) {
      return la->header()<lb->header();
    }
    //now get just some total deterministic order
    static DisagreementSetIterator dsit;
    dsit.reset(la, lb, false);
    ALWAYS(dsit.hasNext());
    auto da = dsit.next();
    if(da.first.isVar()!=da.second.isVar()) {
      return da.first.isVar();
    }
    if(da.first.isVar()) {
      ASS_NEQ(da.first.var(),da.second.var());
      return da.first.var()<da.second.var();
    }
    else {
      ASS_NEQ(da.first.term()->functor(),da.second.term()->functor());
      return da.first.term()->functor()<da.second.term()->functor();
    }
    return a<b; //if nothing else applies, we keep the original order
  }